

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QualifierParser.cpp
# Opt level: O3

void __thiscall Refal2::CQualifierParser::addRightParen(CQualifierParser *this)

{
  bool bVar1;
  string local_38;
  
  bVar1 = (this->builder).negative;
  if (bVar1 == true) {
    (this->builder).negative = false;
    this->afterRightParen = true;
  }
  else if ((this->namedQualifier).type == TT_None) {
    if (this->afterRightParen == false) {
      (this->builder).negative = (bool)(bVar1 ^ 1);
    }
    if ((this->super_CParsingElementState).state != PES_NotFinished) {
      __assert_fail("!IsFinished()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/include/QualifierParser.h"
                    ,0x22,"void Refal2::CParsingElementState::SetFinished(bool)");
    }
    (this->super_CParsingElementState).state = PES_Correct;
  }
  else {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"unexpected right parenthesis in named qualifier","");
    error(this,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void CQualifierParser::addRightParen()
{
	if( builder.IsNegative() ) {
		builder.AddNegative();
		afterRightParen = true;
	} else if( namedQualifier.IsNone() ) {
		if( !afterRightParen ) {
			builder.AddNegative();
		}
		SetCorrect();
	} else {
		error( "unexpected right parenthesis in named qualifier" );
	}
}